

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kronrod.cpp
# Opt level: O3

void kronrod(int n,double eps,double *x,double *w1,double *w2)

{
  uint uVar1;
  int iVar2;
  double *b;
  double *pdVar3;
  double *pdVar4;
  ulong uVar5;
  int iVar6;
  uint m;
  ulong uVar7;
  ulong uVar8;
  double *w2_00;
  long lVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double local_40;
  double xx;
  
  iVar6 = n + 1;
  uVar1 = (n - (iVar6 >> 0x1f)) + 1;
  xx._4_4_ = (int)uVar1 >> 1;
  lVar9 = (long)(int)xx._4_4_;
  uVar7 = lVar9 * 8 + 8;
  if (n < -4) {
    uVar7 = 0xffffffffffffffff;
  }
  b = (double *)operator_new__(uVar7);
  uVar7 = lVar9 * 8;
  if (n < -2) {
    uVar7 = 0xffffffffffffffff;
  }
  pdVar3 = (double *)operator_new__(uVar7);
  dVar16 = 0.0;
  iVar2 = n;
  if (0 < n) {
    do {
      dVar16 = dVar16 + 1.0;
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
  }
  dVar10 = (dVar16 + 2.0) / (dVar16 + dVar16 + 3.0);
  *pdVar3 = dVar10;
  b[lVar9 + -1] = dVar10 + -1.0;
  if (2 < n) {
    dVar10 = -dVar16 * (dVar16 + 1.0);
    uVar7 = 2;
    if (2 < (int)xx._4_4_) {
      uVar7 = (ulong)xx._4_4_;
    }
    pdVar4 = b + lVar9 + -1;
    uVar5 = 1;
    dVar13 = dVar16;
    do {
      dVar13 = dVar13 + 2.0;
      dVar15 = (((dVar13 + -1.0) * dVar13 + dVar10) * (dVar13 + 2.0) * pdVar3[uVar5 - 1]) /
               (((dVar13 + 3.0) * (dVar13 + 2.0) + dVar10) * dVar13);
      pdVar3[uVar5] = dVar15;
      b[(lVar9 - uVar5) + -1] = dVar15;
      uVar8 = 0;
      do {
        dVar15 = dVar15 + pdVar3[uVar8] * pdVar4[uVar8];
        uVar8 = uVar8 + 1;
      } while (uVar5 != uVar8);
      b[(lVar9 - uVar5) + -1] = dVar15;
      uVar5 = uVar5 + 1;
      pdVar4 = pdVar4 + -1;
    } while (uVar5 != uVar7);
  }
  b[lVar9] = 1.0;
  dVar10 = sin(1.570796 / (dVar16 + dVar16 + 1.0));
  dVar13 = 1.0 - dVar10 * dVar10;
  if (dVar13 < 0.0) {
    dVar13 = sqrt(dVar13);
  }
  else {
    dVar13 = SQRT(dVar13);
  }
  dVar11 = (dVar10 + dVar10) * dVar13;
  dVar15 = 1.0 - dVar11 * dVar11;
  if (dVar15 < 0.0) {
    dVar15 = sqrt(dVar15);
  }
  else {
    dVar15 = SQRT(dVar15);
  }
  uVar1 = uVar1 & 0xfffffffe;
  dVar12 = (1.0 - 1.0 / dVar16) / (dVar16 * -8.0 * dVar16) + 1.0;
  local_40 = dVar12 * dVar13;
  dVar16 = 2.0 / (double)(n * 2 + 1);
  m = xx._4_4_;
  if (0 < n) {
    dVar14 = 1.0;
    iVar2 = n;
    do {
      dVar16 = (dVar16 * 4.0 * dVar14) / (double)iVar6;
      dVar14 = dVar14 + 1.0;
      iVar6 = iVar6 + 1;
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
    if (0 < n) {
      w2_00 = w2 + 1;
      uVar7 = 1;
      pdVar4 = w1;
      do {
        abwe1(n,m,eps,dVar16,uVar1 == n,b,&local_40,pdVar4);
        m = xx._4_4_;
        w2_00[-1] = 0.0;
        x[uVar7 - 1] = local_40;
        dVar14 = dVar13 * dVar15 - dVar11 * dVar10;
        local_40 = 0.0;
        if ((uint)n != uVar7) {
          local_40 = dVar12 * dVar14;
        }
        dVar10 = dVar13 * dVar11 + dVar10 * dVar15;
        abwe2(n,xx._4_4_,eps,dVar16,uVar1 == n,b,&local_40,pdVar4 + 1,w2_00);
        x[uVar7] = local_40;
        dVar13 = dVar14 * dVar15 - dVar11 * dVar10;
        dVar10 = dVar14 * dVar11 + dVar10 * dVar15;
        local_40 = dVar12 * dVar13;
        uVar7 = uVar7 + 2;
        w2_00 = w2_00 + 2;
        pdVar4 = pdVar4 + 2;
      } while (uVar7 <= (uint)n);
    }
  }
  if (uVar1 == n) {
    local_40 = 0.0;
    abwe1(n,m,eps,dVar16,true,b,&local_40,w1 + n);
    w2[n] = 0.0;
    x[n] = local_40;
  }
  operator_delete__(b);
  operator_delete__(pdVar3);
  return;
}

Assistant:

void kronrod ( int n, double eps, double x[], double w1[], double w2[] )

//****************************************************************************80
//
//  Purpose:
//
//    KRONROD adds N+1 points to an N-point Gaussian rule.
//
//  Discussion:
//
//    This subroutine calculates the abscissas and weights of the 2N+1
//    point Gauss Kronrod quadrature formula which is obtained from the 
//    N point Gauss quadrature formula by the optimal addition of N+1 points.
//
//    The optimally added points are called Kronrod abscissas.  The 
//    abscissas and weights for both the Gauss and Gauss Kronrod rules
//    are calculated for integration over the interval [-1,+1].
//
//    Since the quadrature formula is symmetric with respect to the origin,
//    only the nonnegative abscissas are calculated.
//
//    Note that the code published in Mathematics of Computation 
//    omitted the definition of the variable which is here called COEF2.
//
//  Storage:
//
//    Given N, let M = ( N + 1 ) / 2.  
//
//    The Gauss-Kronrod rule will include 2*N+1 points.  However, by symmetry,
//    only N + 1 of them need to be listed.
//
//    The arrays X, W1 and W2 contain the nonnegative abscissas in decreasing
//    order, and the weights of each abscissa in the Gauss-Kronrod and
//    Gauss rules respectively.  This means that about half the entries
//    in W2 are zero.
//
//    For instance, if N = 3, the output is:
//
//    I      X               W1              W2
//
//    1    0.960491        0.104656         0.000000   
//    2    0.774597        0.268488         0.555556    
//    3    0.434244        0.401397         0.000000
//    4    0.000000        0.450917         0.888889
//
//    and if N = 4, (notice that 0 is now a Kronrod abscissa)
//    the output is
//
//    I      X               W1              W2
//
//    1    0.976560        0.062977        0.000000   
//    2    0.861136        0.170054        0.347855    
//    3    0.640286        0.266798        0.000000   
//    4    0.339981        0.326949        0.652145    
//    5    0.000000        0.346443        0.000000
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    02 September 2014
//
//  Author:
//
//    Original FORTRAN77 version by Robert Piessens, Maria Branders.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Robert Piessens, Maria Branders,
//    A Note on the Optimal Addition of Abscissas to Quadrature Formulas
//    of Gauss and Lobatto,
//    Mathematics of Computation,
//    Volume 28, Number 125, January 1974, pages 135-139.
//
//  Parameters:
//
//    Input, int N, the order of the Gauss rule.
//
//    Input, double EPS, the requested absolute accuracy of the
//    abscissas.
//
//    Output, double X[N+1], the abscissas.
//
//    Output, double W1[N+1], the weights for the Gauss-Kronrod rule.
//
//    Output, double W2[N+1], the weights for 
//    the Gauss rule.
//
{
  double ak;
  double an;
  double *b;
  double bb;
  double c;
  double coef;
  double coef2;
  double d;
  bool even;
  int i;
  int k;
  int l;
  int ll;
  int m;
  double s;
  double *tau;
  double x1;
  double xx;
  double y;

  b = new double[((n+1)/2)+1];
  tau = new double[(n+1)/2];
  
  m = ( n + 1 ) / 2;
  even = ( 2 * m == n );

  d = 2.0;
  an = 0.0;
  for ( k = 1; k <= n; k++ )
  {
    an = an + 1.0;
    d = d * an / ( an + 0.5 );
  }
//
//  Calculation of the Chebyshev coefficients of the orthogonal polynomial.
//
  tau[0] = ( an + 2.0 ) / ( an + an + 3.0 );
  b[m-1] = tau[0] - 1.0;
  ak = an;

  for ( l = 1; l < m; l++ )
  {
    ak = ak + 2.0;
    tau[l] = ( ( ak - 1.0 ) * ak 
      - an * ( an + 1.0 ) ) * ( ak + 2.0 ) * tau[l-1] 
      / ( ak * ( ( ak + 3.0 ) * ( ak + 2.0 ) 
      - an * ( an + 1.0 ) ) );
    b[m-l-1] = tau[l];

    for ( ll = 1; ll <= l; ll++ )
    {
      b[m-l-1] = b[m-l-1] + tau[ll-1] * b[m-l+ll-1];
    }
  }

  b[m] = 1.0;
//
//  Calculation of approximate values for the abscissas.
//
  bb = sin ( 1.570796 / ( an + an + 1.0 ) );
  x1 = sqrt ( 1.0 - bb * bb );
  s = 2.0 * bb * x1;
  c = sqrt ( 1.0 - s * s );
  coef = 1.0 - ( 1.0 - 1.0 / an ) / ( 8.0 * an * an );
  xx = coef * x1;
//
//  Coefficient needed for weights.
//
//  COEF2 = 2^(2*n+1) * n! * n! / (2n+1)! 
//        = 2 * 4^n * n! / product( (n+1)*...*(2*n+1))
//
  coef2 = 2.0 / double( 2 * n + 1 );
  for ( i = 1; i <= n; i++ )
  {
    coef2 = coef2 * 4.0 * double( i ) / double( n + i );
  }
//
//  Calculation of the K-th abscissa (a Kronrod abscissa) and the
//  corresponding weight.
//
  for ( k = 1; k <= n; k = k + 2 )
  {
    abwe1 ( n, m, eps, coef2, even, b, &xx, w1+k-1 );
    w2[k-1] = 0.0;

    x[k-1] = xx;
    y = x1;
    x1 = y * c - bb * s;
    bb = y * s + bb * c;

    if ( k == n )
    {
      xx = 0.0;
    }
    else
    {
      xx = coef * x1;
    }
//
//  Calculation of the K+1 abscissa (a Gaussian abscissa) and the
//  corresponding weights.
//
    abwe2 ( n, m, eps, coef2, even, b, &xx, w1+k, w2+k );

    x[k] = xx;
    y = x1;
    x1 = y * c - bb * s;
    bb = y * s + bb * c;
    xx = coef * x1;
  }
//
//  If N is even, we have one more Kronrod abscissa to compute,
//  namely the origin.
//
  if ( even )
  {
    xx = 0.0;
    abwe1 ( n, m, eps, coef2, even, b, &xx, w1+n );
    w2[n] = 0.0;
    x[n] = xx;
  }

  delete [] b;
  delete [] tau;

  return;
}